

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O3

void test_bhdct_get_nonexist_many_string_key(planck_unit_test_t *tc)

{
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  char local_98 [16];
  ion_dictionary_t local_88;
  ion_dictionary_handler_t local_70;
  
  local_98[8] = 0;
  local_98[0] = '\0';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  bhdct_setup_string_key(tc,&local_70,&local_88,ion_fill_edge_cases);
  sprintf(local_98,"k%d",0xfffff830);
  bhdct_get(tc,&local_88,local_98,(ion_value_t)0x0,'\x01',0);
  sprintf(local_98,"k%d",3000);
  bhdct_get(tc,&local_88,local_98,(ion_value_t)0x0,'\x01',0);
  bhdct_delete_dictionary(tc,&local_88);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_get_nonexist_many_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_edge_cases);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, -2000);
	bhdct_get(tc, &dict, key, NULL, err_item_not_found, 0);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 3000);
	bhdct_get(tc, &dict, key, NULL, err_item_not_found, 0);

	bhdct_takedown(tc, &dict);
}